

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O3

bool scp::operator==(BigInt<unsigned_int,_unsigned_long> *x,int64_t y)

{
  int8_t iVar1;
  BigInt<unsigned_int,_unsigned_long> local_30;
  
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_30,y);
  iVar1 = BigInt<unsigned_int,_unsigned_long>::compare(x,&local_30);
  if (local_30._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar1 == '\0';
}

Assistant:

constexpr bool operator==(const BigInt<TBase, TBuffer>& x, int64_t y)
	{
		return x.compare(y) == 0;
	}